

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClientTimingLog.cpp
# Opt level: O3

void __thiscall
ViconDataStreamSDK::Core::VClientTimingLog::LogLatencies
          (VClientTimingLog *this,ostream *i_rStream,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *i_rHeadings,
          vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
          *i_rLatencies)

{
  pointer pbVar1;
  pointer pVVar2;
  size_t __n;
  EHeadingComparison EVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  VClientTimingLog *this_00;
  pointer pbVar8;
  
  this_00 = (VClientTimingLog *)&stack0xffffffffffffffb8;
  LogHeadings_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffb8,(VClientTimingLog *)i_rStream,i_rLatencies);
  EVar3 = CompareHeadings(this_00,i_rHeadings,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffffb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffb8);
  if ((int)EVar3 < 2) {
    pbVar8 = (i_rHeadings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (i_rHeadings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 != pbVar1) {
      uVar7 = 0;
      do {
        uVar5 = (ulong)uVar7;
        pVVar2 = (i_rLatencies->
                 super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(i_rLatencies->
                       super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
                -0x3333333333333333;
        if (((uVar6 < uVar5 || uVar6 - uVar5 == 0) ||
            (__n = pbVar8->_M_string_length, __n != pVVar2[uVar5].m_Name._M_string_length)) ||
           ((__n != 0 &&
            (iVar4 = bcmp((pbVar8->_M_dataplus)._M_p,pVVar2[uVar5].m_Name._M_dataplus._M_p,__n),
            iVar4 != 0)))) {
          std::__ostream_insert<char,std::char_traits<char>>(i_rStream,", ",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(i_rStream,", ",2);
          std::ostream::_M_insert<double>
                    ((i_rLatencies->
                     super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar5].m_Latency);
          uVar7 = uVar7 + 1;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar1);
    }
  }
  return;
}

Assistant:

void VClientTimingLog::LogLatencies(std::ostream & i_rStream, const std::vector< std::string > & i_rHeadings, const std::vector< ViconCGStreamDetail::VLatencyInfo_Sample >& i_rLatencies) const
{
  EHeadingComparison Result = CompareHeadings( i_rHeadings, LogHeadings( i_rLatencies ) );
  if( Result <= ESubset )
  { 
    unsigned int LatencyIndex = 0;
    for( const auto& Heading : i_rHeadings)
    {
      if(LatencyIndex < i_rLatencies.size() )
      {
        if( Heading == i_rLatencies[ LatencyIndex ].m_Name )
        { 
          i_rStream << ", " << i_rLatencies[ LatencyIndex ].m_Latency;
          ++LatencyIndex;
        }
        else
        {
          i_rStream << ", ";
        }
      }
      else
      {
        i_rStream << ", ";
      }
    }
  }
  // We need a DSSDK error log
  //else
  //{
  //  i_rStream << ", Headings are " << ( Result == ESuperset ) ? "Superset, " : "Different, ";
  //  for (const auto& rHeading : LogHeadings(i_rLatencies))
  //  {
  //    i_rStream << rHeading << ", ";
  //  }
  //}
}